

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastUR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ulong *puVar3;
  SerialArena *this;
  __int_type_conflict3 _Var4;
  __pointer_type pSVar5;
  char cVar6;
  uint uVar7;
  Rep *pRVar8;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar9;
  string *psVar10;
  string *s;
  ulong uVar11;
  char *pcVar12;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  undefined8 extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  TcParseTableBase *pTVar14;
  ulong uVar15;
  TcParseTableBase *ptr_00;
  uint *puVar16;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 unaff_R13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  undefined1 auVar17 [16];
  pair<const_char_*,_int> pVar18;
  LogMessageFatal local_40 [16];
  
  if (data.field_0._0_2_ != 0) {
    pcVar12 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  uVar2 = *(ushort *)ptr;
  puVar3 = (ulong *)this_00[2].data;
  if (puVar3 != (ulong *)0x0) {
    pTVar14 = (TcParseTableBase *)ptr;
    auVar17 = __tls_get_addr(&PTR_004d49d0);
    uVar13 = auVar17._8_8_;
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(auVar17._0_8_ + 8))->data;
    if (data.field_0.data == (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar3) {
      this = *(SerialArena **)(auVar17._0_8_ + 0x10);
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
      if (((ulong)data.field_0 & 1) == 0) {
        uVar7 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
      }
      else {
        pRVar8 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
        uVar7 = pRVar8->allocated_size;
        uVar13 = extraout_RDX;
      }
      if (uVar7 == *(uint *)(this_00 + 1)) {
        do {
          bVar1 = (byte)*(ushort *)((long)ptr + 2);
          ptr_00 = (TcParseTableBase *)(ulong)bVar1;
          uVar7 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            pVar18 = ReadSizeFallback((char *)((long)ptr + 2),(uint)bVar1);
            uVar7 = pVar18.second;
          }
          else {
            pVar18._8_8_ = uVar13;
            pVar18.first = (char *)((long)ptr + 3);
            ptr_00 = pTVar14;
          }
          ctx_00 = pVar18._8_8_;
          pTVar14 = (TcParseTableBase *)pVar18.first;
          if (pTVar14 == (TcParseTableBase *)0x0) {
            ptr = (char *)0x0;
          }
          else {
            _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
            if (_Var4 != 0) {
              uVar11 = _Var4 - 0x20;
              (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar11;
              pSVar5 = (this->string_block_)._M_b._M_p;
              uVar15 = (ulong)pSVar5->allocated_size_ - 0x10;
              if (uVar15 < uVar11) {
                psVar10 = absl::lts_20240722::log_internal::
                          MakeCheckOpString<unsigned_long,unsigned_long>
                                    (uVar11,uVar15,"offset <= effective_size()");
              }
              else {
                psVar10 = (string *)0x0;
              }
              if (psVar10 != (string *)0x0) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          (local_40,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/string_block.h"
                           ,0xa2,*(undefined8 *)(psVar10 + 8),*(undefined8 *)psVar10);
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
              }
              unaff_R13.data = (long)&pSVar5[-1].next_ + _Var4;
            }
            data.field_0 = unaff_R13;
            if (_Var4 == 0) {
              data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                             SerialArena::AllocateFromStringBlockFallback(this);
            }
            *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
            *(undefined8 *)((long)data.field_0 + 8) = 0;
            *(undefined1 *)((long)data.field_0 + 0x10) = 0;
            RepeatedPtrFieldBase::AddAllocatedForParse
                      ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
            ptr = EpsCopyInputStream::ReadString
                            (&ctx->super_EpsCopyInputStream,(char *)pTVar14,uVar7,
                             (string *)data.field_0);
            ctx_00 = extraout_RDX_00;
            ptr_00 = pTVar14;
          }
          if ((ushort *)ptr == (ushort *)0x0) goto LAB_0029a777;
          pVVar9 = RepeatedPtrFieldBase::
                   Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
          pTVar14 = (TcParseTableBase *)(pVVar9->_M_dataplus)._M_p;
          cVar6 = utf8_range::IsStructurallyValid(pVVar9->_M_string_length);
          if (cVar6 == '\0') goto LAB_0029a762;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0029a72e;
          uVar13 = extraout_RDX_01;
        } while (*(ushort *)ptr == uVar2);
        goto LAB_0029a6e2;
      }
    }
  }
  do {
    ptr_00 = (TcParseTableBase *)((long)ptr + 2);
    s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
    ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
    ctx_00 = extraout_RDX_02;
    if ((ushort *)ptr == (ushort *)0x0) goto LAB_0029a777;
    pVVar9 = RepeatedPtrFieldBase::
             Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
    cVar6 = utf8_range::IsStructurallyValid(pVVar9->_M_string_length,(pVVar9->_M_dataplus)._M_p);
    if (cVar6 == '\0') goto LAB_0029a762;
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0029a72e;
  } while (*(ushort *)ptr == uVar2);
LAB_0029a6e2:
  if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar7 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar11 = (ulong)(uVar7 & 0xfffffff8);
    pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar11))
                                (msg,ptr,ctx,
                                 (ulong)*(ushort *)ptr ^
                                 *(ulong *)(&table[1].fast_idx_mask + uVar11 * 2),table,hasbits);
    return pcVar12;
  }
LAB_0029a72e:
  if ((ulong)table->has_bits_offset != 0) {
    puVar16 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar16 & 3) != 0) {
      AlignFail();
    }
    *puVar16 = *puVar16 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_0029a762:
  ptr_00 = table;
  ReportFastUtf8Error((int)(char)uVar2 + (uint)uVar2 >> 1,table);
  ctx_00 = extraout_RDX_03;
LAB_0029a777:
  pcVar12 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
  return pcVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<uint16_t,
                                          RepeatedPtrField<std::string>, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}